

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O2

void generalSolveTest1(int dim,int dl)

{
  CSC *pCVar1;
  pointer pdVar2;
  Matrix *pMVar3;
  Matrix *pMVar4;
  TriangularSolve *pTVar5;
  CSR *pCVar6;
  TriangularSolve *this;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  diagonal *this_00;
  pointer pdVar10;
  int iVar11;
  bool bVar12;
  double durationSym1;
  int local_14c;
  Matrix *local_148;
  TriangularSolve *local_140;
  Matrix *local_138;
  Matrix *local_130;
  CSC *local_128;
  CSR *local_120;
  vector<double,_std::allocator<double>_> t4;
  vector<double,_std::allocator<double>_> t3;
  vector<double,_std::allocator<double>_> t2;
  vector<double,_std::allocator<double>_> t1;
  string local_90;
  string local_70;
  string local_50;
  
  t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_14c = dl;
  pMVar3 = (Matrix *)operator_new(0x30);
  local_130 = pMVar3;
  std::__cxx11::string::string((string *)&local_50," ",(allocator *)&durationSym1);
  Matrix::Matrix(pMVar3,dim,dim,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"diagonal",(allocator *)&durationSym1);
  Matrix::Random(pMVar3,local_14c,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  Matrix::LowerTriangular(pMVar3);
  pMVar4 = (Matrix *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_90,"rhs",(allocator *)&durationSym1);
  Matrix::Matrix(pMVar4,dim,1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  Matrix::Random(pMVar4);
  pTVar5 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(pTVar5,dim);
  pCVar6 = (CSR *)operator_new(0x30);
  CSR::CSR(pCVar6,pMVar3);
  this = (TriangularSolve *)operator_new(4);
  local_148 = (Matrix *)CONCAT44(local_148._4_4_,dim);
  local_140 = pTVar5;
  local_138 = pMVar4;
  local_120 = pCVar6;
  TriangularSolve::TriangularSolve(this,dim);
  iVar11 = 5;
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    lVar7 = std::chrono::_V2::system_clock::now();
    pMVar3 = TriangularSolve::solve(local_140,local_120,local_138);
    lVar8 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar8 - lVar7) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&t1,&durationSym1);
    if (pMVar3 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar3);
    }
    operator_delete(pMVar3,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  pCVar6 = local_120;
  poVar9 = std::operator<<((ostream *)&std::cout,"solve(CSR)");
  std::operator<<(poVar9,",");
  pdVar2 = t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar10 = t1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
    poVar9 = std::ostream::_M_insert<double>(*pdVar10);
    std::operator<<(poVar9,",");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  iVar11 = CSR::turntoCSC(pCVar6);
  local_128 = (CSC *)operator_new(0x30);
  CSC::CSC(local_128,(int)local_148,(int)local_148,iVar11,pCVar6->ptr,pCVar6->idx,pCVar6->val);
  iVar11 = 5;
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    lVar7 = std::chrono::_V2::system_clock::now();
    pMVar3 = TriangularSolve::solve(local_140,local_128,local_138);
    lVar8 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar8 - lVar7) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&t2,&durationSym1);
    if (pMVar3 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar3);
    }
    operator_delete(pMVar3,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  poVar9 = std::operator<<((ostream *)&std::cout,"solve(CSC)");
  std::operator<<(poVar9,",");
  pdVar2 = t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar10 = t2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
    poVar9 = std::ostream::_M_insert<double>(*pdVar10);
    std::operator<<(poVar9,",");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  this_00 = (diagonal *)operator_new(0x18);
  diagonal::diagonal(this_00,(int)local_148,(int)local_148,local_14c);
  local_148 = diagonal::diaStore(this_00,local_130,1);
  diagonal::offsetCompute(this_00,1);
  iVar11 = 5;
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    lVar7 = std::chrono::_V2::system_clock::now();
    pMVar3 = TriangularSolve::solved1(local_140,local_148,local_138,local_14c);
    lVar8 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar8 - lVar7) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&t3,&durationSym1);
    if (pMVar3 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar3);
    }
    operator_delete(pMVar3,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  poVar9 = std::operator<<((ostream *)&std::cout,"solve(dia1)");
  std::operator<<(poVar9,",");
  pdVar2 = t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar10 = t3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
    poVar9 = std::ostream::_M_insert<double>(*pdVar10);
    std::operator<<(poVar9,",");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMVar3 = diagonal::diaStore2(this_00,local_130,1);
  iVar11 = 5;
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    lVar7 = std::chrono::_V2::system_clock::now();
    pMVar4 = TriangularSolve::solve(local_140,pMVar3,local_138,local_14c);
    lVar8 = std::chrono::_V2::system_clock::now();
    durationSym1 = (double)(lVar8 - lVar7) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::push_back(&t4,&durationSym1);
    if (pMVar4 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar4);
    }
    operator_delete(pMVar4,0x30);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  pCVar6 = local_120;
  poVar9 = std::operator<<((ostream *)&std::cout,"solve(dia2)");
  std::operator<<(poVar9,",");
  pdVar2 = t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar10 = t4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
    poVar9 = std::ostream::_M_insert<double>(*pdVar10);
    std::operator<<(poVar9,",");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  pMVar4 = local_130;
  Matrix::~Matrix(local_130);
  operator_delete(pMVar4,0x30);
  pMVar4 = local_138;
  Matrix::~Matrix(local_138);
  operator_delete(pMVar4,0x30);
  pTVar5 = local_140;
  TriangularSolve::~TriangularSolve(local_140);
  operator_delete(pTVar5,4);
  CSR::~CSR(pCVar6);
  operator_delete(pCVar6,0x30);
  TriangularSolve::~TriangularSolve(this);
  operator_delete(this,4);
  pCVar1 = local_128;
  CSC::~CSC(local_128);
  operator_delete(pCVar1,0x30);
  diagonal::~diagonal(this_00);
  operator_delete(this_00,0x18);
  pMVar4 = local_148;
  if (local_148 != (Matrix *)0x0) {
    Matrix::~Matrix(local_148);
  }
  operator_delete(pMVar4,0x30);
  if (pMVar3 != (Matrix *)0x0) {
    Matrix::~Matrix(pMVar3);
  }
  operator_delete(pMVar3,0x30);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&t4.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&t3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&t2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&t1.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void generalSolveTest1(int dim, int dl)

{
// 7 for col and row - 4 for diagonal
    vector<double> t1;
    vector<double> t2;
    vector<double> t3;
    vector<double> t4;
    Matrix *dia = new Matrix(dim,dim," ");
    dia->Random(dl,"diagonal");
    dia->LowerTriangular();
    // dia->print();
   // Matrix *v1 = dia->addTest(); // for testing vOne
    //v1->print();
   // Matrix *vOne = new Matrix(dim,1,"v for test"); // for testing with vOne
   // vOne->One();
     Matrix *v1 = new Matrix(dim, 1, "rhs");
     v1->Random();
    // v1->print();

    TriangularSolve *s = new TriangularSolve(dim);

//csrSolve
    CSR *cr1 = new CSR(dia);
    TriangularSolve *rs = new TriangularSolve(dim);//dim:row numbers
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result1 = s->solve(cr1,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym1 = elapsed_seconds.count();
        // cout << "execution time (CSR Solve):" << durationSym1 << "\n";
        // result1->print();
        t1.push_back(durationSym1);
        delete result1;
    }
    sort(t1.begin(), t1.end());
    cout << "solve(CSR)"<<",";
    for (auto x : t1)
        cout << x << ",";
    cout<<"\n";

    //csr Solve,Test
    // Matrix *rs2 = cr1->csrMult(result1);
    //   rs3->print();
    // bool r1 = rs2->isequal(v1);
    //  cout<<"Testing solve (CSR): "<<r1 <<"\n";

//CSC solve
    int nnz = cr1->turntoCSC();
    CSC *cc1 = new CSC(dim, dim, nnz, cr1->ptr, cr1->idx, cr1->val);

    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result2 = s->solve(cc1,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym2 = elapsed_seconds.count();
        //cout << "execution time (CSC Solve):" << durationSym2 << "\n";
        //result2->print();
        t2.push_back(durationSym2);
        delete result2;
    }
    sort(t2.begin(),t2.end());
    cout << "solve(CSC)"<<",";
    for(auto x:t2)
        cout<<x<<",";
    cout<<"\n";
    //csc Solve,Test
    //Matrix *mcc2 = cc1->cscMult(result2);
    //  mcc2->print();
    // bool r2 = mcc2->isequal(v1);
    //  cout<<"Testing solve (CSC) is: "<<r2 <<"\n";

    //dia1
    diagonal *d1 = new diagonal(dim,dim,dl);
    Matrix *d2 = d1->diaStore(dia,1);//1 for Lower Triangular Matrix
    // d2->print();
    int *f = d1->offsetCompute(1);//1 for Lower Triangular Matrix

    // TriangularSolve *d = new TriangularSolve(100);//n:row number
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result3 = s->solved1(d2,v1,dl);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym3 = elapsed_seconds.count();
        //cout << "execution time (diagonal1 Solve):" << durationSym3 << "\n";
        // result3->print();
        t3.push_back(durationSym3);
        delete result3;
    }
    sort(t3.begin(), t3.end());
    cout << "solve(dia1)"<<",";
    for(auto x:t3)
        cout<<x<<",";
    cout<<"\n";
    //test
    //Matrix *ts1 = d1->diaMult(d2,result3);
    // bool r3 = ts1->isequal(v1);
    // cout<<"testing solve(dia1): "<<r3<<"\n";

//dia2

    Matrix *d3 = d1->diaStore2(dia,1);
    //d3->print();
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result4 = s->solve(d3,v1,dl);//number of diagonals
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym4 = elapsed_seconds.count();
        // cout << "execution time (diagonal2 Solve):" << durationSym4 << "\n";
        // result4->print();
        t4.push_back(durationSym4);
        delete result4;
    }
    sort(t4.begin(), t4.end());
    cout << "solve(dia2)"<<",";
    for(auto x:t4)
        cout<<x<<",";
    cout<<"\n";
    //test
    //Matrix *ts2 = d1->diaMult2(d3,result4);
    // bool r4 = ts2->isequal(v1);
    // cout<<"testing solve(dia2): "<<r4<<"\n";

    //comparing dia1 and dia2 solve
    /* bool r5 = result3->isequal(result4);
     bool r6 = result1->isequal(result2);
     bool r7 = result2->isequal(result3);
     cout<<"dia1&dia2&csr&csc: "<<r5<< ","<< r6 << ","<< r7<<"\n";

     cout<<"test with  vector One:"<<"\n";
     bool r10 = result1->isequal(vOne);
     bool r11 = result2->isequal(vOne);
     bool r12 = result3->isequal(vOne);
     bool r13 = result4->isequal(vOne);
     cout<<"dia1&dia2&csr&csc: "<<r10<< ","<< r11 << ","<< r12<<","<< r13<<"\n";*/

    delete dia;
    delete v1;
    delete s;
    delete cr1;
    delete rs;
    delete cc1;
    delete d1;
    delete d2;
    delete d3;


    // delete rs2;
//    delete cs;
    //  delete result1;
    // delete mcc2;
    //  delete d;
    // delete result3;
    //  delete ts1;
    //  delete result4;
    // delete ts2;

}